

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isGatherOffsetsCompareResultValid
               (ConstPixelBufferAccess *texture,Sampler *sampler,TexComparePrecision *prec,
               Vec2 *coord,int coordZ,IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  int size;
  int size_00;
  int iVar1;
  bool isFixedPoint;
  CmpResultSet CVar2;
  int i;
  int j;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_68;
  TexVerifierUtil local_40 [8];
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&texture->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(texture->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            (local_40,sampler->normalizedCoords,(texture->m_size).m_data[1],coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar4 = floorf(local_38 + -0.5);
  fVar5 = floorf(local_34 + -0.5);
  fVar6 = floorf(local_40._0_4_ + -0.5);
  fVar7 = floorf(local_40._4_4_ + -0.5);
  local_68 = (int)fVar6;
  if (local_68 <= (int)fVar7) {
    size = (texture->m_size).m_data[0];
    size_00 = (texture->m_size).m_data[1];
    iVar1 = (int)fVar4;
    do {
      for (; iVar1 <= (int)fVar5; iVar1 = iVar1 + 1) {
        uVar3 = 0xffffffffffffffff;
        while( true ) {
          i = TexVerifierUtil::wrap(sampler->wrapS,(*offsets)[uVar3 + 1].m_data[0] + iVar1,size);
          j = TexVerifierUtil::wrap
                        (sampler->wrapT,(*offsets)[uVar3 + 1].m_data[1] + local_68,size_00);
          fVar6 = lookupDepth(texture,sampler,i,j,coordZ);
          CVar2 = execCompare(sampler->compare,fVar6,cmpReference,prec->referenceBits,isFixedPoint);
          fVar6 = result->m_data[uVar3 + 1];
          fVar8 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
          fVar9 = fVar6 - fVar8;
          fVar6 = fVar6 + fVar8;
          if ((((((ushort)CVar2 & 1) == 0) || (1.0 < fVar9)) || (fVar6 < 1.0)) &&
             ((((ushort)CVar2 >> 8 & 1) == 0 || (0.0 < fVar9 || fVar6 < 0.0)))) break;
          uVar3 = uVar3 + 1;
          if (2 < uVar3) {
            return true;
          }
        }
      }
      local_68 = local_68 + 1;
      iVar1 = (int)fVar4;
    } while (local_68 <= (int)fVar7);
  }
  return false;
}

Assistant:

static bool isGatherOffsetsCompareResultValid (const ConstPixelBufferAccess&	texture,
											   const Sampler&					sampler,
											   const TexComparePrecision&		prec,
											   const Vec2&						coord,
											   int								coordZ,
											   const IVec2						(&offsets)[4],
											   float							cmpReference,
											   const Vec4&						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getWidth(),		coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI				= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI				= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ				= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ				= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w					= texture.getWidth();
	const int	h					= texture.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			bool isCurrentPixelValid = true;

			for (int offNdx = 0; offNdx < 4 && isCurrentPixelValid; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int			x		= wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int			y		= wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				const float			depth	= lookupDepth(texture, sampler, x, y, coordZ);
				const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

				if (!isResultInSet(resSet, result[offNdx], prec.resultBits))
					isCurrentPixelValid = false;
			}

			if (isCurrentPixelValid)
				return true;
		}
	}

	return false;
}